

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O2

self_type * __thiscall
viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::operator-
          (self_type *__return_storage_ptr__,
          rt_vector_expr<viennamath::rt_expression_interface<double>_> *this,self_type *other)

{
  pointer prVar1;
  long lVar2;
  ulong uVar3;
  type local_50;
  
  lVar2 = (long)(this->
                super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ).
                super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->
                super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ).
                super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 == (long)(other->
                     super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                     ).
                     super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(other->
                     super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                     ).
                     super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
    rt_vector_expr(__return_storage_ptr__,lVar2 >> 3);
    lVar2 = 0;
    for (uVar3 = 0;
        prVar1 = (other->
                 super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                 ).
                 super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(other->
                              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                              ).
                              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)prVar1 >> 3);
        uVar3 = uVar3 + 1) {
      result_of::
      subtract<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
      ::instance(&local_50,
                 (rt_expr<viennamath::rt_expression_interface<double>_> *)
                 ((long)&(((this->
                           super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                           ).
                           super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->rt_expr_)._M_ptr + lVar2),
                 (rt_expr<viennamath::rt_expression_interface<double>_> *)
                 ((long)&(prVar1->rt_expr_)._M_ptr + lVar2));
      rt_expr<viennamath::rt_expression_interface<double>_>::operator=
                ((rt_expr<viennamath::rt_expression_interface<double>_> *)
                 ((long)&(((__return_storage_ptr__->
                           super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                           ).
                           super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->rt_expr_)._M_ptr + lVar2),
                 &local_50);
      rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_50);
      lVar2 = lVar2 + 8;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("BaseType::size() == other.size() && \"Expression vector dimensions mismatch\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/viennamath/runtime/vector_expr.hpp"
                ,0x4b,
                "self_type viennamath::rt_vector_expr<>::operator-(const self_type &) const [InterfaceType = viennamath::rt_expression_interface<double>]"
               );
}

Assistant:

self_type operator-(self_type const & other) const
      {
        assert(BaseType::size() == other.size() && "Expression vector dimensions mismatch");

        self_type result(other.size());
        for (std::size_t i=0; i<other.size(); ++i)
          result[i] = (*this)[i] - other[i];

        return result;
      }